

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

int32_t __thiscall llama_context::output_reserve(llama_context *this,int32_t n_outputs)

{
  ggml_backend_buffer_ptr *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  llama_model *plVar4;
  ggml_backend_buffer *pgVar5;
  pointer __s;
  pointer piVar6;
  uint32_t uVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  ggml_backend_dev_t pgVar11;
  long lVar12;
  pointer __p;
  float *pfVar13;
  float *pfVar14;
  ulong uVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  
  plVar4 = this->model;
  uVar15 = (ulong)(this->cparams).n_seq_max;
  if ((long)uVar15 < (long)n_outputs) {
    uVar15 = (long)n_outputs;
  }
  uVar2 = (this->cparams).n_batch;
  uVar7 = llama_vocab::n_tokens(&plVar4->vocab);
  bVar1 = (this->cparams).embeddings;
  bVar16 = (this->cparams).pooling_type == LLAMA_POOLING_TYPE_NONE & bVar1;
  bVar19 = this->model->arch == LLM_ARCH_T5;
  uVar3 = (plVar4->hparams).n_embd;
  bVar17 = bVar1 ^ 1;
  sVar8 = uVar7 * uVar15;
  if ((bVar17 & 1) == 0 && !bVar19) {
    sVar8 = 0;
  }
  this->logits_size = sVar8;
  sVar8 = uVar3 * uVar15;
  if (bVar16 == 0 && !bVar19) {
    sVar8 = 0;
  }
  this->embd_size = sVar8;
  if ((this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::resize(&this->output_ids,(ulong)uVar2);
  }
  if ((this->buf_output)._M_t.
      super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
      super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl == (ggml_backend_buffer *)0x0
     ) {
    uVar9 = 0;
  }
  else {
    uVar9 = ggml_backend_buffer_get_size();
  }
  pgVar5 = (this->buf_output)._M_t.
           super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
           super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
           super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl;
  uVar18 = (this->embd_size + this->logits_size) * 4;
  if ((pgVar5 == (ggml_backend_buffer *)0x0) || (uVar9 < uVar18)) {
    this_00 = &this->buf_output;
    if (pgVar5 != (ggml_backend_buffer *)0x0) {
      std::__uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>::reset
                ((__uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)this_00,
                 (pointer)0x0);
      this->logits = (float *)0x0;
      this->embd = (float *)0x0;
    }
    lVar10 = ggml_backend_cpu_buffer_type();
    pgVar11 = llama_model::dev_output(this->model);
    if (pgVar11 == (ggml_backend_dev_t)0x0) {
      lVar12 = 0;
    }
    else {
      lVar12 = ggml_backend_dev_host_buffer_type(pgVar11);
    }
    if (lVar12 != 0) {
      lVar10 = lVar12;
    }
    __p = (pointer)ggml_backend_buft_alloc_buffer(lVar10,uVar18);
    std::__uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>::reset
              ((__uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)this_00,__p);
    if ((this_00->_M_t).super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t
        .super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
        super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl ==
        (ggml_backend_buffer *)0x0) {
      auVar20._8_4_ = (int)(uVar18 >> 0x20);
      auVar20._0_8_ = uVar18;
      auVar20._12_4_ = 0x45300000;
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: failed to allocate output buffer of size %.2f MiB\n",
                         ((auVar20._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) *
                         9.5367431640625e-07,"output_reserve");
      uVar15 = 0;
      goto LAB_0018cf99;
    }
  }
  pfVar13 = (float *)ggml_backend_buffer_get_base
                               ((this->buf_output)._M_t.
                                super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>
                                .super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl);
  pfVar14 = (float *)0x0;
  if ((bVar17 & 1) != 0 || bVar19) {
    pfVar14 = pfVar13;
  }
  this->logits = pfVar14;
  pfVar14 = pfVar13 + this->logits_size;
  if (bVar16 == 0 && !bVar19) {
    pfVar14 = (float *)0x0;
  }
  __s = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  this->embd = pfVar14;
  piVar6 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != piVar6) {
    memset(__s,0xff,((long)piVar6 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  ggml_backend_buffer_clear
            ((this->buf_output)._M_t.
             super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
             super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl,0);
  this->n_outputs = 0;
  this->n_outputs_max = (int32_t)uVar15;
LAB_0018cf99:
  return (int32_t)uVar15;
}

Assistant:

int32_t llama_context::output_reserve(int32_t n_outputs) {
    const auto & hparams = model.hparams;
    const auto & vocab   = model.vocab;

    const int64_t n_outputs_max = std::max<int64_t>(n_outputs, n_seq_max());

    const auto n_batch = cparams.n_batch;
    const auto n_vocab = vocab.n_tokens();
    const auto n_embd  = hparams.n_embd;

    // TODO: use a per-batch flag for logits presence instead
    bool has_logits = !cparams.embeddings;
    bool has_embd   =  cparams.embeddings && (cparams.pooling_type == LLAMA_POOLING_TYPE_NONE);

    // TODO: hacky enc-dec support
    if (model.arch == LLM_ARCH_T5) {
        has_logits = true;
        has_embd   = true;
    }

    logits_size = has_logits ? n_vocab*n_outputs_max : 0;
    embd_size   = has_embd   ?  n_embd*n_outputs_max : 0;

    if (output_ids.empty()) {
        // init, never resized afterwards
        output_ids.resize(n_batch);
    }

    const size_t prev_size = buf_output ? ggml_backend_buffer_get_size(buf_output.get()) : 0;
    const size_t new_size  = (logits_size + embd_size) * sizeof(float);

    // alloc only when more than the current capacity is required
    // TODO: also consider shrinking the buffer
    if (!buf_output || prev_size < new_size) {
        if (buf_output) {
#ifndef NDEBUG
            // This doesn't happen often, but may be annoying in some cases (like the HellaSwag benchmark)
            LLAMA_LOG_INFO("%s: reallocating output buffer from size %.02f MiB to %.02f MiB\n", __func__, prev_size / 1024.0 / 1024.0, new_size / 1024.0 / 1024.0);
#endif
            buf_output = nullptr;
            logits = nullptr;
            embd = nullptr;
        }

        auto * buft = ggml_backend_cpu_buffer_type();
        // try to use the host buffer of the device where the output tensor is allocated for faster transfer to system memory
        auto * output_dev = model.dev_output();
        auto * output_dev_host_buft = output_dev ? ggml_backend_dev_host_buffer_type(output_dev) : nullptr;
        if (output_dev_host_buft) {
            buft = output_dev_host_buft;
        }
        buf_output.reset(ggml_backend_buft_alloc_buffer(buft, new_size));
        if (buf_output == nullptr) {
            LLAMA_LOG_ERROR("%s: failed to allocate output buffer of size %.2f MiB\n", __func__, new_size / (1024.0 * 1024.0));
            return 0;
        }
    }

    float * output_base = (float *) ggml_backend_buffer_get_base(buf_output.get());

    logits = has_logits ? output_base               : nullptr;
    embd   = has_embd   ? output_base + logits_size : nullptr;

    // set all ids as invalid (negative)
    std::fill(output_ids.begin(), output_ids.end(), -1);

    ggml_backend_buffer_clear(buf_output.get(), 0);

    this->n_outputs     = 0;
    this->n_outputs_max = n_outputs_max;

    return n_outputs_max;
}